

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

Program __thiscall Pass1::run(Pass1 *this,char *file_name)

{
  Function *pFVar1;
  mapped_type *ppFVar2;
  Type *pTVar3;
  mapped_type *ppFVar4;
  Function *extraout_RDX;
  Program PVar5;
  Program old_program;
  FunctionTable function_table;
  string path;
  FunctionTableKey new_key;
  FileTable file_table;
  char *file_name_local;
  
  old_program.first = (Function *)0x0;
  old_program.last = (Function *)0x0;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &file_table._M_t._M_impl.super__Rb_tree_header._M_header;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  file_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  file_name_local = file_name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&new_key,&file_name_local,auto_format);
  std::filesystem::__cxx11::path::lexically_normal();
  std::filesystem::__cxx11::path::string(&path,(path *)&function_table);
  std::filesystem::__cxx11::path::~path((path *)&function_table);
  std::filesystem::__cxx11::path::~path((path *)&new_key);
  pFVar1 = MoebiusParser::parse_program(path._M_dataplus._M_p,&old_program);
  ppFVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
            ::operator[](&file_table,&path);
  *ppFVar2 = pFVar1;
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->old_program = (Program *)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppFVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
            ::operator[](&file_table,&path);
  new_key.old_function = *ppFVar2;
  new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar1 = (Function *)operator_new(0x60);
  pTVar3 = TypeInterner::get_void_type();
  (pFVar1->path)._M_dataplus._M_p = (pointer)&(pFVar1->path).field_2;
  (pFVar1->path)._M_string_length = 0;
  (pFVar1->path).field_2._M_local_buf[0] = '\0';
  (pFVar1->block).first = (Expression *)0x0;
  (pFVar1->block).last = (Expression *)0x0;
  pFVar1->arguments = 0;
  (pFVar1->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar1->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar1->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar1->return_type = pTVar3;
  pFVar1->next_function = (Function *)0x0;
  Program::add_function((Program *)this,pFVar1);
  ppFVar4 = std::
            map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
            ::operator[](&function_table,&new_key);
  *ppFVar4 = pFVar1;
  evaluate(&old_program,(Program *)this,&file_table,&function_table,&new_key,&pFVar1->block,
           &(new_key.old_function)->block);
  std::_Vector_base<const_Type_*,_std::allocator<const_Type_*>_>::~_Vector_base
            (&new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>
            );
  std::
  _Rb_tree<Pass1::FunctionTableKey,_std::pair<const_Pass1::FunctionTableKey,_Function_*>,_std::_Select1st<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::~_Rb_tree(&function_table._M_t);
  std::__cxx11::string::~string((string *)&path);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::~_Rb_tree(&file_table._M_t);
  Program::~Program(&old_program);
  PVar5.last = extraout_RDX;
  PVar5.first = (Function *)this;
  return PVar5;
}

Assistant:

static Program run(const char* file_name) {
		Program old_program;
		FileTable file_table;
		const std::string path = std::filesystem::path(file_name).lexically_normal().string();
		file_table[path] = MoebiusParser::parse_program(path.c_str(), &old_program);
		Program new_program;
		FunctionTable function_table;
		FunctionTableKey new_key(file_table[path]);
		Function* new_function = new Function(TypeInterner::get_void_type());
		new_program.add_function(new_function);
		function_table[new_key] = new_function;
		evaluate(&old_program, &new_program, file_table, function_table, new_key, new_function->get_block(), new_key.old_function->get_block());
		return new_program;
	}